

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::
WriteValue<duckdb::QualifiedColumnName,std::__cxx11::string,duckdb::QualifiedColumnHashFunction,duckdb::QualifiedColumnEquality>
          (Serializer *this,
          unordered_map<duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::QualifiedColumnHashFunction,_duckdb::QualifiedColumnEquality,_std::allocator<std::pair<const_duckdb::QualifiedColumnName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *map)

{
  __node_base *p_Var1;
  
  (*this->_vptr_Serializer[8])();
  p_Var1 = &(map->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    (*this->_vptr_Serializer[6])(this);
    WriteProperty<duckdb::QualifiedColumnName>(this,0,"key",(QualifiedColumnName *)(p_Var1 + 1));
    WriteProperty<std::__cxx11::string>
              (this,1,"value",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var1 + 0x11))
    ;
    (*this->_vptr_Serializer[7])(this);
  }
  (*this->_vptr_Serializer[9])(this);
  return;
}

Assistant:

void WriteValue(const duckdb::unordered_map<K, V, HASH, CMP> &map) {
		auto count = map.size();
		OnListBegin(count);
		for (auto &item : map) {
			OnObjectBegin();
			WriteProperty(0, "key", item.first);
			WriteProperty(1, "value", item.second);
			OnObjectEnd();
		}
		OnListEnd();
	}